

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gls::MultiVertexArrayTest::iterate(MultiVertexArrayTest *this)

{
  ContextArrayPack *pCVar1;
  GLValue min;
  GLValue min_00;
  GLValue max;
  GLValue max_00;
  Storage SVar2;
  undefined4 uVar3;
  bool bVar4;
  Profile PVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  TestLog *this_00;
  MessageBuilder *this_01;
  reference pvVar9;
  size_type sVar10;
  long lVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar12;
  long lVar13;
  int local_4d8;
  float local_4d0;
  float local_4cc;
  float local_4c4;
  Error *err;
  float gridSize;
  size_t bufferSize;
  size_t stride;
  char *data;
  InputType local_2b0;
  int seed;
  ArraySpec arraySpec_2;
  InputType local_268;
  int arrayNdx_1;
  ArraySpec arraySpec_1;
  InputType local_220;
  int arrayNdx;
  ArraySpec arraySpec;
  string local_1d0;
  MessageBuilder local_1b0;
  ApiType local_30;
  byte local_29;
  float local_28;
  float fStack_24;
  bool useVao;
  float colorScale;
  float coordScale;
  size_t primitiveSize;
  MultiVertexArrayTest *this_local;
  
  primitiveSize = (size_t)this;
  if (this->m_iteration == 0) {
    _colorScale = (ulong)((this->m_spec).primitive == PRIMITIVE_TRIANGLES) * 5 + 1;
    fStack_24 = 1.0;
    local_28 = 1.0;
    local_30.m_bits = (*((this->super_VertexArrayTest).m_renderCtx)->_vptr_RenderContext[2])();
    PVar5 = glu::ApiType::getProfile(&local_30);
    local_29 = PVar5 == PROFILE_CORE;
    this_00 = tcu::TestContext::getLog
                        ((this->super_VertexArrayTest).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    Spec::getDesc_abi_cxx11_(&local_1d0,&this->m_spec);
    this_01 = tcu::MessageBuilder::operator<<(&local_1b0,&local_1d0);
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_1d0);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    pvVar9 = std::
             vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
             ::operator[](&(this->m_spec).arrays,0);
    memcpy(&local_220,pvVar9,0x40);
    if (local_220 == INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
      if (((byte)arraySpec.offset & 1) == 0) {
        fStack_24 = 0.0009765625;
      }
      else {
        fStack_24 = 1.0;
      }
    }
    else if (local_220 == INPUTTYPE_INT_2_10_10_10) {
      if (((byte)arraySpec.offset & 1) == 0) {
        fStack_24 = 0.001953125;
      }
      else {
        fStack_24 = 1.0;
      }
    }
    else {
      if ((((byte)arraySpec.offset & 1) == 0) || (bVar4 = inputTypeIsFloatType(local_220), bVar4)) {
        local_4c4 = gls::GLValue::toFloat((GLValue *)&arraySpec.min.field_1.fl);
        local_4c4 = 0.9 / local_4c4;
      }
      else {
        local_4c4 = 1.0;
      }
      fStack_24 = local_4c4;
    }
    if (((((arrayNdx == 2) || (arrayNdx == 3)) || (arrayNdx == 7)) ||
        ((arrayNdx == 8 || (arrayNdx == 10)))) || (arrayNdx == 0xb)) {
      fStack_24 = fStack_24 * 0.5;
    }
    for (arraySpec_1.max.field_1._4_4_ = 1; uVar3 = arraySpec_1.max.field_1._4_4_,
        sVar10 = std::
                 vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                 ::size(&(this->m_spec).arrays), (int)uVar3 < (int)sVar10;
        arraySpec_1.max.field_1._4_4_ = arraySpec_1.max.field_1._4_4_ + 1) {
      pvVar9 = std::
               vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
               ::operator[](&(this->m_spec).arrays,(long)(int)arraySpec_1.max.field_1._4_4_);
      memcpy(&local_268,pvVar9,0x40);
      if ((((byte)arraySpec_1.offset & 1) == 0) || (bVar4 = inputTypeIsFloatType(local_268), bVar4))
      {
        local_4cc = gls::GLValue::toFloat((GLValue *)&arraySpec_1.min.field_1.fl);
        local_4cc = 1.0 / local_4cc;
      }
      else {
        local_4cc = 1.0;
      }
      local_28 = local_4cc * local_28;
      if (arrayNdx_1 == 3) {
        if ((((byte)arraySpec_1.offset & 1) == 0) ||
           (bVar4 = inputTypeIsFloatType(local_268), bVar4)) {
          local_4d0 = gls::GLValue::toFloat((GLValue *)&arraySpec_1.min.field_1.fl);
          local_4d0 = 1.0 / local_4d0;
        }
        else {
          local_4d0 = 1.0;
        }
        local_28 = local_4d0 * local_28;
      }
    }
    for (arraySpec_2.max.field_1._4_4_ = 0; uVar3 = arraySpec_2.max.field_1._4_4_,
        sVar10 = std::
                 vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                 ::size(&(this->m_spec).arrays), (int)uVar3 < (int)sVar10;
        arraySpec_2.max.field_1._4_4_ = arraySpec_2.max.field_1._4_4_ + 1) {
      pvVar9 = std::
               vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
               ::operator[](&(this->m_spec).arrays,(long)(int)arraySpec_2.max.field_1._4_4_);
      memcpy(&local_2b0,pvVar9,0x40);
      SVar2 = arraySpec_2.storage;
      iVar6 = local_2b0 + seed * 10 + arraySpec_2.inputType * 100 + (this->m_spec).primitive * 1000
              + arraySpec_2.outputType * 10000 + (this->m_spec).drawCount +
              arraySpec_2.storage * 0xc + arraySpec_2.componentCount +
              (uint)((byte)arraySpec_2.offset & 1);
      stride = 0;
      if (arraySpec_2.componentCount == 0) {
        local_4d8 = gls::Array::inputTypeSize(local_2b0);
        local_4d8 = SVar2 * local_4d8;
      }
      else {
        local_4d8 = arraySpec_2.componentCount;
      }
      SVar2 = arraySpec_2.storage;
      lVar11 = (long)(int)arraySpec_2.usage;
      lVar13 = (this->m_spec).drawCount * _colorScale;
      iVar7 = gls::Array::inputTypeSize(local_2b0);
      uVar12 = lVar11 + (long)local_4d8 * (lVar13 + -1) + (long)(int)(SVar2 * iVar7);
      iVar7 = (*((this->super_VertexArrayTest).m_renderCtx)->_vptr_RenderContext[4])();
      iVar7 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar7));
      iVar8 = (*((this->super_VertexArrayTest).m_renderCtx)->_vptr_RenderContext[4])();
      iVar8 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar8));
      iVar7 = de::min<int>(iVar7,iVar8);
      if ((this->m_spec).primitive == PRIMITIVE_TRIANGLES) {
        if (arraySpec_2.max.field_1._4_4_ == 0) {
          min_00.field_1 = (anon_union_8_10_1f5805e9_for_GLValue_1)arraySpec_2.min._0_8_;
          min_00.type = arraySpec_2.stride;
          min_00._4_1_ = arraySpec_2.normalize;
          min_00._5_3_ = arraySpec_2._29_3_;
          max_00.field_1 = (anon_union_8_10_1f5805e9_for_GLValue_1)arraySpec_2.max._0_8_;
          max_00._0_8_ = arraySpec_2.min.field_1;
          stride = (size_t)RandomArrayGenerator::generateQuads
                                     (iVar6,(this->m_spec).drawCount,arraySpec_2.storage,
                                      arraySpec_2.usage,arraySpec_2.componentCount,
                                      (this->m_spec).primitive,local_2b0,min_00,max_00,
                                      3.0 / (float)(iVar7 + -1));
        }
        else {
          min.field_1.fl.m_value = (Float)(Float)arraySpec_2.min.type;
          min.type = arraySpec_2.stride;
          min._4_1_ = arraySpec_2.normalize;
          min._5_3_ = arraySpec_2._29_3_;
          min.field_1._4_4_ = arraySpec_2.min._4_4_;
          max.field_1 = (anon_union_8_10_1f5805e9_for_GLValue_1)arraySpec_2.max._0_8_;
          max._0_8_ = arraySpec_2.min.field_1;
          stride = (size_t)RandomArrayGenerator::generatePerQuad
                                     (iVar6,(this->m_spec).drawCount,arraySpec_2.storage,
                                      arraySpec_2.componentCount,(this->m_spec).primitive,local_2b0,
                                      min,max);
        }
      }
      pCVar1 = (this->super_VertexArrayTest).m_glArrayPack;
      (*pCVar1->_vptr_ContextArrayPack[4])(pCVar1,(ulong)arraySpec_2.inputType);
      pCVar1 = (this->super_VertexArrayTest).m_rrArrayPack;
      (*pCVar1->_vptr_ContextArrayPack[4])(pCVar1,(ulong)arraySpec_2.inputType);
      pCVar1 = (this->super_VertexArrayTest).m_glArrayPack;
      iVar6 = (*pCVar1->_vptr_ContextArrayPack[2])
                        (pCVar1,(ulong)(uint)arraySpec_2.max.field_1._4_4_);
      (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar6) + 0x10))
                ((long *)CONCAT44(extraout_var_01,iVar6),1,uVar12 & 0xffffffff,stride,
                 arraySpec_2.outputType);
      pCVar1 = (this->super_VertexArrayTest).m_rrArrayPack;
      iVar6 = (*pCVar1->_vptr_ContextArrayPack[2])
                        (pCVar1,(ulong)(uint)arraySpec_2.max.field_1._4_4_);
      (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar6) + 0x10))
                ((long *)CONCAT44(extraout_var_02,iVar6),1,uVar12 & 0xffffffff,stride,
                 arraySpec_2.outputType);
      pCVar1 = (this->super_VertexArrayTest).m_glArrayPack;
      iVar6 = (*pCVar1->_vptr_ContextArrayPack[2])
                        (pCVar1,(ulong)(uint)arraySpec_2.max.field_1._4_4_);
      (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar6) + 0x20))
                ((long *)CONCAT44(extraout_var_03,iVar6),arraySpec_2.max.field_1._4_4_,
                 arraySpec_2.usage,arraySpec_2.storage,local_2b0,seed,(byte)arraySpec_2.offset & 1,
                 arraySpec_2.componentCount);
      pCVar1 = (this->super_VertexArrayTest).m_rrArrayPack;
      iVar6 = (*pCVar1->_vptr_ContextArrayPack[2])
                        (pCVar1,(ulong)(uint)arraySpec_2.max.field_1._4_4_);
      (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar6) + 0x20))
                ((long *)CONCAT44(extraout_var_04,iVar6),arraySpec_2.max.field_1._4_4_,
                 arraySpec_2.usage,arraySpec_2.storage,local_2b0,seed,(byte)arraySpec_2.offset & 1,
                 arraySpec_2.componentCount);
      if (stride != 0) {
        operator_delete__((void *)stride);
      }
    }
    pCVar1 = (this->super_VertexArrayTest).m_glArrayPack;
    (*pCVar1->_vptr_ContextArrayPack[5])
              ((ulong)(uint)fStack_24,(ulong)(uint)local_28,pCVar1,(ulong)(this->m_spec).primitive,
               (ulong)(uint)(this->m_spec).first,
               (ulong)(uint)((this->m_spec).drawCount * (int)colorScale),(ulong)(local_29 & 1));
    pCVar1 = (this->super_VertexArrayTest).m_rrArrayPack;
    (*pCVar1->_vptr_ContextArrayPack[5])
              ((ulong)(uint)fStack_24,(ulong)(uint)local_28,pCVar1,(ulong)(this->m_spec).primitive,
               (ulong)(uint)(this->m_spec).first,
               (ulong)(uint)((this->m_spec).drawCount * (int)colorScale),(ulong)(local_29 & 1));
    this->m_iteration = this->m_iteration + 1;
    this_local._4_4_ = CONTINUE;
  }
  else if (this->m_iteration == 1) {
    VertexArrayTest::compare(&this->super_VertexArrayTest);
    if (((this->super_VertexArrayTest).m_isOk & 1U) == 0) {
      bVar4 = isUnalignedBufferOffsetTest(this);
      if (bVar4) {
        tcu::TestContext::setTestResult
                  ((this->super_VertexArrayTest).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_COMPATIBILITY_WARNING,"Failed to draw with unaligned buffers.");
      }
      else {
        bVar4 = isUnalignedBufferStrideTest(this);
        if (bVar4) {
          tcu::TestContext::setTestResult
                    ((this->super_VertexArrayTest).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_COMPATIBILITY_WARNING,"Failed to draw with unaligned stride.");
        }
        else {
          tcu::TestContext::setTestResult
                    ((this->super_VertexArrayTest).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Image comparison failed.");
        }
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_VertexArrayTest).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
    }
    this->m_iteration = this->m_iteration + 1;
    this_local._4_4_ = STOP;
  }
  else {
    this_local._4_4_ = STOP;
  }
  return this_local._4_4_;
}

Assistant:

MultiVertexArrayTest::IterateResult MultiVertexArrayTest::iterate (void)
{
	if (m_iteration == 0)
	{
		const size_t	primitiveSize		= (m_spec.primitive == Array::PRIMITIVE_TRIANGLES) ? (6) : (1); // in non-indexed draw Triangles means rectangles
		float			coordScale			= 1.0f;
		float			colorScale			= 1.0f;
		const bool		useVao				= m_renderCtx.getType().getProfile() == glu::PROFILE_CORE;

		// Log info
		m_testCtx.getLog() << TestLog::Message << m_spec.getDesc() << TestLog::EndMessage;

		// Color and Coord scale
		{
			// First array is always position
			{
				Spec::ArraySpec arraySpec = m_spec.arrays[0];
				if (arraySpec.inputType == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10)
				{
					if (arraySpec.normalize)
						coordScale = 1.0f;
					else
						coordScale = 1.0 / 1024.0;
				}
				else if (arraySpec.inputType == Array::INPUTTYPE_INT_2_10_10_10)
				{
					if (arraySpec.normalize)
						coordScale = 1.0f;
					else
						coordScale = 1.0 / 512.0;
				}
				else
					coordScale = (arraySpec.normalize && !inputTypeIsFloatType(arraySpec.inputType) ? 1.0f : float(0.9 / double(arraySpec.max.toFloat())));

				if (arraySpec.outputType == Array::OUTPUTTYPE_VEC3 || arraySpec.outputType == Array::OUTPUTTYPE_VEC4
					|| arraySpec.outputType == Array::OUTPUTTYPE_IVEC3 || arraySpec.outputType == Array::OUTPUTTYPE_IVEC4
					|| arraySpec.outputType == Array::OUTPUTTYPE_UVEC3 || arraySpec.outputType == Array::OUTPUTTYPE_UVEC4)
						coordScale = coordScale * 0.5f;
			}

			// And other arrays are color-like
			for (int arrayNdx = 1; arrayNdx < (int)m_spec.arrays.size(); arrayNdx++)
			{
				Spec::ArraySpec arraySpec	= m_spec.arrays[arrayNdx];

				colorScale *= (arraySpec.normalize && !inputTypeIsFloatType(arraySpec.inputType) ? 1.0f : float(1.0 / double(arraySpec.max.toFloat())));
				if (arraySpec.outputType == Array::OUTPUTTYPE_VEC4)
					colorScale *= (arraySpec.normalize && !inputTypeIsFloatType(arraySpec.inputType) ? 1.0f : float(1.0 / double(arraySpec.max.toFloat())));
			}
		}

		// Data
		for (int arrayNdx = 0; arrayNdx < (int)m_spec.arrays.size(); arrayNdx++)
		{
			Spec::ArraySpec arraySpec		= m_spec.arrays[arrayNdx];
			const int		seed			= int(arraySpec.inputType) + 10 * int(arraySpec.outputType) + 100 * int(arraySpec.storage) + 1000 * int(m_spec.primitive) + 10000 * int(arraySpec.usage) + int(m_spec.drawCount) + 12 * int(arraySpec.componentCount) + int(arraySpec.stride) + int(arraySpec.normalize);
			const char*		data			= DE_NULL;
			const size_t	stride			= (arraySpec.stride == 0) ? (arraySpec.componentCount * Array::inputTypeSize(arraySpec.inputType)) : (arraySpec.stride);
			const size_t	bufferSize		= arraySpec.offset + stride * (m_spec.drawCount * primitiveSize - 1) + arraySpec.componentCount  * Array::inputTypeSize(arraySpec.inputType);
			// Snap values to at least 3x3 grid
			const float		gridSize		= 3.0f / (float)(de::min(m_renderCtx.getRenderTarget().getWidth(), m_renderCtx.getRenderTarget().getHeight()) - 1);

			switch (m_spec.primitive)
			{
	//			case Array::PRIMITIVE_POINTS:
	//				data = RandomArrayGenerator::generateArray(seed, arraySpec.min, arraySpec.max, arraySpec.count, arraySpec.componentCount, arraySpec.stride, arraySpec.inputType);
	//				break;
				case Array::PRIMITIVE_TRIANGLES:
					if (arrayNdx == 0)
					{
						data = RandomArrayGenerator::generateQuads(seed, m_spec.drawCount, arraySpec.componentCount, arraySpec.offset, arraySpec.stride, m_spec.primitive, arraySpec.inputType, arraySpec.min, arraySpec.max, gridSize);
					}
					else
					{
						DE_ASSERT(arraySpec.offset == 0); // \note [jarkko] it just hasn't been implemented
						data = RandomArrayGenerator::generatePerQuad(seed, m_spec.drawCount, arraySpec.componentCount, arraySpec.stride, m_spec.primitive, arraySpec.inputType, arraySpec.min, arraySpec.max);
					}
					break;

				default:
					DE_ASSERT(false);
					break;
			}

			m_glArrayPack->newArray(arraySpec.storage);
			m_rrArrayPack->newArray(arraySpec.storage);

			m_glArrayPack->getArray(arrayNdx)->data(Array::TARGET_ARRAY, (int)bufferSize, data, arraySpec.usage);
			m_rrArrayPack->getArray(arrayNdx)->data(Array::TARGET_ARRAY, (int)bufferSize, data, arraySpec.usage);

			m_glArrayPack->getArray(arrayNdx)->bind(arrayNdx, arraySpec.offset, arraySpec.componentCount, arraySpec.inputType, arraySpec.outputType, arraySpec.normalize, arraySpec.stride);
			m_rrArrayPack->getArray(arrayNdx)->bind(arrayNdx, arraySpec.offset, arraySpec.componentCount, arraySpec.inputType, arraySpec.outputType, arraySpec.normalize, arraySpec.stride);

			delete [] data;
		}

		try
		{
			m_glArrayPack->render(m_spec.primitive, m_spec.first, m_spec.drawCount * (int)primitiveSize, useVao, coordScale, colorScale);
			m_rrArrayPack->render(m_spec.primitive, m_spec.first, m_spec.drawCount * (int)primitiveSize, useVao, coordScale, colorScale);
		}
		catch (glu::Error& err)
		{
			// GL Errors are ok if the mode is not properly aligned

			m_testCtx.getLog() << TestLog::Message << "Got error: " << err.what() << TestLog::EndMessage;

			if (isUnalignedBufferOffsetTest())
				m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned buffers.");
			else if (isUnalignedBufferStrideTest())
				m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned stride.");
			else
				throw;

			return STOP;
		}

		m_iteration++;
		return CONTINUE;
	}
	else if (m_iteration == 1)
	{
		compare();

		if (m_isOk)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
		else
		{
			if (isUnalignedBufferOffsetTest())
				m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned buffers.");
			else if (isUnalignedBufferStrideTest())
				m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned stride.");
			else
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed.");
		}

		m_iteration++;
		return STOP;
	}
	else
	{
		DE_ASSERT(false);
		return STOP;
	}
}